

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O0

QMenu * __thiscall QLineEdit::createStandardContextMenu(QLineEdit *this)

{
  QLatin1StringView str_14;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  QLineEditPrivate *pQVar5;
  QMenu *pQVar6;
  ulong uVar7;
  QGuiApplicationPrivate *pQVar8;
  QAction *pQVar9;
  QUnicodeControlCharacterMenu *this_00;
  QObject *_editWidget;
  long in_FS_OFFSET;
  QUnicodeControlCharacterMenu *ctrlCharacterMenu;
  QAction *action;
  QMenu *popup;
  QLineEditPrivate *d;
  char16_t *str_7;
  char16_t *str_6;
  char16_t *str_3;
  char16_t *str_2;
  char16_t *str_1;
  char16_t *str;
  char16_t *str_5;
  char16_t *str_4;
  char16_t *str_12;
  char16_t *str_9;
  char16_t *str_8;
  char16_t *str_11;
  char16_t *str_10;
  char16_t *str_13;
  undefined4 in_stack_fffffffffffff278;
  undefined4 uVar10;
  int in_stack_fffffffffffff27c;
  QWidgetLineControl *in_stack_fffffffffffff280;
  QWidget *in_stack_fffffffffffff288;
  QWidgetLineControl *in_stack_fffffffffffff290;
  QWidget *in_stack_fffffffffffff298;
  QMenu *in_stack_fffffffffffff2a0;
  QMenu *in_stack_fffffffffffff2b8;
  offset_in_QWidgetLineControl_to_subr *in_stack_fffffffffffff2c0;
  offset_in_QLineEdit_to_subr *slot;
  ContextType *in_stack_fffffffffffff2c8;
  QArrayDataPointer<char16_t> *this_01;
  Object *in_stack_fffffffffffff2d0;
  QUnicodeControlCharacterMenu *sender;
  QAction *in_stack_fffffffffffff2f0;
  ConnectionType in_stack_fffffffffffff310;
  Data *header;
  Connection local_860;
  QArrayDataPointer<char16_t> local_858;
  offset_in_QLineEdit_to_subr local_840 [3];
  QArrayDataPointer<char16_t> local_828 [3];
  QKeySequence local_7e0 [8];
  undefined1 local_7d8 [30];
  undefined2 local_7ba;
  QKeySequence local_798 [128];
  code *local_718;
  undefined8 local_710;
  Connection local_708;
  QArrayDataPointer<char16_t> local_700 [2];
  QArrayDataPointer<char16_t> local_6d0 [4];
  code *local_670;
  undefined8 local_668;
  Connection local_660;
  QArrayDataPointer<char16_t> local_658 [2];
  QArrayDataPointer<char16_t> local_628 [2];
  undefined1 local_5f8 [24];
  QKeySequence local_5e0 [8];
  undefined1 local_5d8 [30];
  undefined2 local_5ba;
  QKeySequence local_598 [128];
  code *local_518;
  undefined8 local_510;
  Connection local_508;
  QArrayDataPointer<char16_t> local_500 [2];
  QArrayDataPointer<char16_t> local_4d0 [2];
  QKeySequence local_4a0 [8];
  undefined1 local_498 [30];
  undefined2 local_47a;
  QKeySequence local_458 [128];
  code *local_3d8;
  undefined8 local_3d0;
  Connection local_3c8;
  QArrayDataPointer<char16_t> local_3c0 [2];
  QArrayDataPointer<char16_t> local_390 [2];
  QKeySequence local_360 [8];
  undefined1 local_358 [30];
  undefined2 local_33a;
  QKeySequence local_318 [128];
  code *local_298;
  undefined8 local_290;
  Connection local_288;
  QArrayDataPointer<char16_t> local_280 [2];
  QArrayDataPointer<char16_t> local_250 [2];
  QKeySequence local_220 [8];
  undefined1 local_218 [30];
  undefined2 local_1fa;
  QKeySequence local_1d8 [128];
  code *local_158;
  undefined8 local_150;
  Connection local_148;
  QArrayDataPointer<char16_t> local_140 [2];
  QArrayDataPointer<char16_t> local_110 [2];
  QKeySequence local_e0 [8];
  undefined1 local_d8 [30];
  undefined2 local_ba;
  QKeySequence local_98 [144];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = d_func((QLineEdit *)0x5c8989);
  pQVar6 = (QMenu *)operator_new(0x28);
  QMenu::QMenu(in_stack_fffffffffffff2a0,in_stack_fffffffffffff298);
  Qt::Literals::StringLiterals::operator____L1
            ((char *)in_stack_fffffffffffff288,(size_t)in_stack_fffffffffffff280);
  str_14.m_data = (char *)in_stack_fffffffffffff298;
  str_14.m_size = (qsizetype)in_stack_fffffffffffff290;
  QAnyStringView::QAnyStringView((QAnyStringView *)in_stack_fffffffffffff288,str_14);
  QObject::setObjectName((QAnyStringView *)pQVar6);
  bVar3 = isReadOnly((QLineEdit *)in_stack_fffffffffffff280);
  if (!bVar3) {
    tr((char *)in_stack_fffffffffffff288,(char *)in_stack_fffffffffffff280,in_stack_fffffffffffff27c
      );
    uVar7 = QCoreApplication::testAttribute(AA_DontShowShortcutsInContextMenus);
    bVar2 = false;
    bVar1 = false;
    bVar4 = false;
    bVar3 = false;
    if ((uVar7 & 1) == 0) {
      pQVar8 = QGuiApplicationPrivate::instance();
      QKeySequence::QKeySequence(local_98,Undo);
      bVar2 = true;
      uVar7 = QShortcutMap::hasShortcutForKeySequence((QKeySequence *)(pQVar8 + 0x140));
      if ((uVar7 & 1) != 0) goto LAB_005c8b73;
      local_ba = 9;
      QKeySequence::QKeySequence(local_e0,Undo);
      bVar1 = true;
      QKeySequence::toString((SequenceFormat)local_d8);
      bVar4 = true;
      ::operator+((char16_t *)in_stack_fffffffffffff288,(QString *)in_stack_fffffffffffff280);
      bVar3 = true;
      ::QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<char16_t,_QString> *)
                 CONCAT44(in_stack_fffffffffffff27c,in_stack_fffffffffffff278));
    }
    else {
LAB_005c8b73:
      QString::QString((QString *)0x5c8b80);
    }
    ::operator+((QString *)in_stack_fffffffffffff288,(QString *)in_stack_fffffffffffff280);
    ::QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<QString,_QString> *)
               CONCAT44(in_stack_fffffffffffff27c,in_stack_fffffffffffff278));
    pQVar9 = QWidget::addAction((QWidget *)in_stack_fffffffffffff290,
                                (QString *)in_stack_fffffffffffff288);
    QString::~QString((QString *)0x5c8bdc);
    QStringBuilder<QString,_QString>::~QStringBuilder
              ((QStringBuilder<QString,_QString> *)in_stack_fffffffffffff280);
    QString::~QString((QString *)0x5c8bf6);
    if (bVar3) {
      QStringBuilder<char16_t,_QString>::~QStringBuilder
                ((QStringBuilder<char16_t,_QString> *)0x5c8c0f);
    }
    if (bVar4) {
      QString::~QString((QString *)0x5c8c28);
    }
    if (bVar1) {
      QKeySequence::~QKeySequence(local_e0);
    }
    if (bVar2) {
      QKeySequence::~QKeySequence(local_98);
    }
    QString::~QString((QString *)0x5c8c67);
    QWidgetLineControl::isUndoAvailable(in_stack_fffffffffffff290);
    QAction::setEnabled(SUB81(pQVar9,0));
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_110,(Data *)0x0,L"edit-undo",9);
    QString::QString((QString *)in_stack_fffffffffffff280,
                     (DataPointer *)CONCAT44(in_stack_fffffffffffff27c,in_stack_fffffffffffff278));
    QObject::setObjectName<void>
              ((QObject *)in_stack_fffffffffffff280,
               (QString *)CONCAT44(in_stack_fffffffffffff27c,in_stack_fffffffffffff278));
    QString::~QString((QString *)0x5c8d4f);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)in_stack_fffffffffffff280);
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_140,(Data *)0x0,L"edit-undo",9);
    QString::QString((QString *)in_stack_fffffffffffff280,
                     (DataPointer *)CONCAT44(in_stack_fffffffffffff27c,in_stack_fffffffffffff278));
    setActionIcon((QAction *)in_stack_fffffffffffff280,
                  (QString *)CONCAT44(in_stack_fffffffffffff27c,in_stack_fffffffffffff278));
    QString::~QString((QString *)0x5c8e00);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)in_stack_fffffffffffff280);
    local_158 = undo;
    local_150 = 0;
    uVar10 = 0;
    QObject::connect<void(QAction::*)(bool),void(QLineEdit::*)()>
              (in_stack_fffffffffffff2d0,(offset_in_QAction_to_subr)in_stack_fffffffffffff2f0,
               (ContextType *)in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0,
               in_stack_fffffffffffff310);
    QMetaObject::Connection::~Connection(&local_148);
    tr((char *)in_stack_fffffffffffff288,(char *)in_stack_fffffffffffff280,in_stack_fffffffffffff27c
      );
    uVar7 = QCoreApplication::testAttribute(AA_DontShowShortcutsInContextMenus);
    bVar2 = false;
    bVar1 = false;
    bVar4 = false;
    bVar3 = false;
    if ((uVar7 & 1) == 0) {
      pQVar8 = QGuiApplicationPrivate::instance();
      QKeySequence::QKeySequence(local_1d8,Redo);
      bVar2 = true;
      uVar7 = QShortcutMap::hasShortcutForKeySequence((QKeySequence *)(pQVar8 + 0x140));
      if ((uVar7 & 1) != 0) goto LAB_005c8fb2;
      local_1fa = 9;
      QKeySequence::QKeySequence(local_220,Redo);
      bVar1 = true;
      QKeySequence::toString((SequenceFormat)local_218);
      bVar4 = true;
      ::operator+((char16_t *)in_stack_fffffffffffff288,(QString *)in_stack_fffffffffffff280);
      bVar3 = true;
      ::QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<char16_t,_QString> *)CONCAT44(in_stack_fffffffffffff27c,uVar10));
    }
    else {
LAB_005c8fb2:
      QString::QString((QString *)0x5c8fbf);
    }
    ::operator+((QString *)in_stack_fffffffffffff288,(QString *)in_stack_fffffffffffff280);
    ::QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<QString,_QString> *)CONCAT44(in_stack_fffffffffffff27c,uVar10));
    pQVar9 = QWidget::addAction((QWidget *)in_stack_fffffffffffff290,
                                (QString *)in_stack_fffffffffffff288);
    QString::~QString((QString *)0x5c901b);
    QStringBuilder<QString,_QString>::~QStringBuilder
              ((QStringBuilder<QString,_QString> *)in_stack_fffffffffffff280);
    QString::~QString((QString *)0x5c9035);
    if (bVar3) {
      QStringBuilder<char16_t,_QString>::~QStringBuilder
                ((QStringBuilder<char16_t,_QString> *)0x5c904e);
    }
    if (bVar4) {
      QString::~QString((QString *)0x5c9067);
    }
    if (bVar1) {
      QKeySequence::~QKeySequence(local_220);
    }
    if (bVar2) {
      QKeySequence::~QKeySequence(local_1d8);
    }
    QString::~QString((QString *)0x5c90a6);
    QWidgetLineControl::isRedoAvailable(in_stack_fffffffffffff290);
    QAction::setEnabled(SUB81(pQVar9,0));
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_250,(Data *)0x0,L"edit-redo",9);
    QString::QString((QString *)in_stack_fffffffffffff280,
                     (DataPointer *)CONCAT44(in_stack_fffffffffffff27c,uVar10));
    QObject::setObjectName<void>
              ((QObject *)in_stack_fffffffffffff280,
               (QString *)CONCAT44(in_stack_fffffffffffff27c,uVar10));
    QString::~QString((QString *)0x5c918e);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)in_stack_fffffffffffff280);
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_280,(Data *)0x0,L"edit-redo",9);
    QString::QString((QString *)in_stack_fffffffffffff280,
                     (DataPointer *)CONCAT44(in_stack_fffffffffffff27c,uVar10));
    setActionIcon((QAction *)in_stack_fffffffffffff280,
                  (QString *)CONCAT44(in_stack_fffffffffffff27c,uVar10));
    QString::~QString((QString *)0x5c923f);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)in_stack_fffffffffffff280);
    local_298 = redo;
    local_290 = 0;
    in_stack_fffffffffffff278 = 0;
    QObject::connect<void(QAction::*)(bool),void(QLineEdit::*)()>
              (in_stack_fffffffffffff2d0,(offset_in_QAction_to_subr)in_stack_fffffffffffff2f0,
               (ContextType *)in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0,
               in_stack_fffffffffffff310);
    QMetaObject::Connection::~Connection(&local_288);
    QMenu::addSeparator((QMenu *)in_stack_fffffffffffff290);
  }
  bVar3 = isReadOnly((QLineEdit *)in_stack_fffffffffffff280);
  if (!bVar3) {
    tr((char *)in_stack_fffffffffffff288,(char *)in_stack_fffffffffffff280,in_stack_fffffffffffff27c
      );
    uVar7 = QCoreApplication::testAttribute(AA_DontShowShortcutsInContextMenus);
    bVar2 = false;
    bVar1 = false;
    bVar4 = false;
    bVar3 = false;
    if ((uVar7 & 1) == 0) {
      pQVar8 = QGuiApplicationPrivate::instance();
      QKeySequence::QKeySequence(local_318,Cut);
      bVar2 = true;
      uVar7 = QShortcutMap::hasShortcutForKeySequence((QKeySequence *)(pQVar8 + 0x140));
      if ((uVar7 & 1) != 0) goto LAB_005c9413;
      local_33a = 9;
      QKeySequence::QKeySequence(local_360,Cut);
      bVar1 = true;
      QKeySequence::toString((SequenceFormat)local_358);
      bVar4 = true;
      ::operator+((char16_t *)in_stack_fffffffffffff288,(QString *)in_stack_fffffffffffff280);
      bVar3 = true;
      ::QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<char16_t,_QString> *)
                 CONCAT44(in_stack_fffffffffffff27c,in_stack_fffffffffffff278));
    }
    else {
LAB_005c9413:
      QString::QString((QString *)0x5c9420);
    }
    ::operator+((QString *)in_stack_fffffffffffff288,(QString *)in_stack_fffffffffffff280);
    ::QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<QString,_QString> *)
               CONCAT44(in_stack_fffffffffffff27c,in_stack_fffffffffffff278));
    pQVar9 = QWidget::addAction((QWidget *)in_stack_fffffffffffff290,
                                (QString *)in_stack_fffffffffffff288);
    QString::~QString((QString *)0x5c947c);
    QStringBuilder<QString,_QString>::~QStringBuilder
              ((QStringBuilder<QString,_QString> *)in_stack_fffffffffffff280);
    QString::~QString((QString *)0x5c9496);
    if (bVar3) {
      QStringBuilder<char16_t,_QString>::~QStringBuilder
                ((QStringBuilder<char16_t,_QString> *)0x5c94af);
    }
    if (bVar4) {
      QString::~QString((QString *)0x5c94c8);
    }
    if (bVar1) {
      QKeySequence::~QKeySequence(local_360);
    }
    if (bVar2) {
      QKeySequence::~QKeySequence(local_318);
    }
    QString::~QString((QString *)0x5c9507);
    bVar3 = QWidgetLineControl::isReadOnly((QWidgetLineControl *)pQVar5->control);
    if ((!bVar3) && (bVar3 = QWidgetLineControl::hasSelectedText(in_stack_fffffffffffff280), bVar3))
    {
      QWidgetLineControl::echoMode((QWidgetLineControl *)pQVar5->control);
    }
    QAction::setEnabled(SUB81(pQVar9,0));
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_390,(Data *)0x0,L"edit-cut",8);
    QString::QString((QString *)in_stack_fffffffffffff280,
                     (DataPointer *)CONCAT44(in_stack_fffffffffffff27c,in_stack_fffffffffffff278));
    QObject::setObjectName<void>
              ((QObject *)in_stack_fffffffffffff280,
               (QString *)CONCAT44(in_stack_fffffffffffff27c,in_stack_fffffffffffff278));
    QString::~QString((QString *)0x5c9650);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)in_stack_fffffffffffff280);
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_3c0,(Data *)0x0,L"edit-cut",8);
    QString::QString((QString *)in_stack_fffffffffffff280,
                     (DataPointer *)CONCAT44(in_stack_fffffffffffff27c,in_stack_fffffffffffff278));
    setActionIcon((QAction *)in_stack_fffffffffffff280,
                  (QString *)CONCAT44(in_stack_fffffffffffff27c,in_stack_fffffffffffff278));
    QString::~QString((QString *)0x5c9701);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)in_stack_fffffffffffff280);
    local_3d8 = cut;
    local_3d0 = 0;
    in_stack_fffffffffffff278 = 0;
    QObject::connect<void(QAction::*)(bool),void(QLineEdit::*)()>
              (in_stack_fffffffffffff2d0,(offset_in_QAction_to_subr)in_stack_fffffffffffff2f0,
               (ContextType *)in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0,
               in_stack_fffffffffffff310);
    QMetaObject::Connection::~Connection(&local_3c8);
  }
  tr((char *)in_stack_fffffffffffff288,(char *)in_stack_fffffffffffff280,in_stack_fffffffffffff27c);
  uVar7 = QCoreApplication::testAttribute(AA_DontShowShortcutsInContextMenus);
  bVar2 = false;
  bVar1 = false;
  bVar4 = false;
  bVar3 = false;
  if ((uVar7 & 1) == 0) {
    pQVar8 = QGuiApplicationPrivate::instance();
    QKeySequence::QKeySequence(local_458,Copy);
    bVar2 = true;
    uVar7 = QShortcutMap::hasShortcutForKeySequence((QKeySequence *)(pQVar8 + 0x140));
    if ((uVar7 & 1) != 0) goto LAB_005c98b3;
    local_47a = 9;
    QKeySequence::QKeySequence(local_4a0,Copy);
    bVar1 = true;
    QKeySequence::toString((SequenceFormat)local_498);
    bVar4 = true;
    ::operator+((char16_t *)in_stack_fffffffffffff288,(QString *)in_stack_fffffffffffff280);
    bVar3 = true;
    ::QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<char16_t,_QString> *)
               CONCAT44(in_stack_fffffffffffff27c,in_stack_fffffffffffff278));
  }
  else {
LAB_005c98b3:
    QString::QString((QString *)0x5c98c0);
  }
  ::operator+((QString *)in_stack_fffffffffffff288,(QString *)in_stack_fffffffffffff280);
  ::QStringBuilder::operator_cast_to_QString
            ((QStringBuilder<QString,_QString> *)
             CONCAT44(in_stack_fffffffffffff27c,in_stack_fffffffffffff278));
  pQVar9 = QWidget::addAction((QWidget *)in_stack_fffffffffffff290,
                              (QString *)in_stack_fffffffffffff288);
  QString::~QString((QString *)0x5c991c);
  QStringBuilder<QString,_QString>::~QStringBuilder
            ((QStringBuilder<QString,_QString> *)in_stack_fffffffffffff280);
  QString::~QString((QString *)0x5c9936);
  if (bVar3) {
    QStringBuilder<char16_t,_QString>::~QStringBuilder
              ((QStringBuilder<char16_t,_QString> *)0x5c994f);
  }
  if (bVar4) {
    QString::~QString((QString *)0x5c9968);
  }
  if (bVar1) {
    QKeySequence::~QKeySequence(local_4a0);
  }
  if (bVar2) {
    QKeySequence::~QKeySequence(local_458);
  }
  QString::~QString((QString *)0x5c99a7);
  bVar3 = QWidgetLineControl::hasSelectedText(in_stack_fffffffffffff280);
  if (bVar3) {
    QWidgetLineControl::echoMode((QWidgetLineControl *)pQVar5->control);
  }
  QAction::setEnabled(SUB81(pQVar9,0));
  QArrayDataPointer<char16_t>::QArrayDataPointer(local_4d0,(Data *)0x0,L"edit-copy",9);
  QString::QString((QString *)in_stack_fffffffffffff280,
                   (DataPointer *)CONCAT44(in_stack_fffffffffffff27c,in_stack_fffffffffffff278));
  QObject::setObjectName<void>
            ((QObject *)in_stack_fffffffffffff280,
             (QString *)CONCAT44(in_stack_fffffffffffff27c,in_stack_fffffffffffff278));
  QString::~QString((QString *)0x5c9acc);
  QArrayDataPointer<char16_t>::~QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)in_stack_fffffffffffff280);
  QArrayDataPointer<char16_t>::QArrayDataPointer(local_500,(Data *)0x0,L"edit-copy",9);
  QString::QString((QString *)in_stack_fffffffffffff280,
                   (DataPointer *)CONCAT44(in_stack_fffffffffffff27c,in_stack_fffffffffffff278));
  setActionIcon((QAction *)in_stack_fffffffffffff280,
                (QString *)CONCAT44(in_stack_fffffffffffff27c,in_stack_fffffffffffff278));
  QString::~QString((QString *)0x5c9b7d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)in_stack_fffffffffffff280);
  local_518 = copy;
  local_510 = 0;
  uVar10 = 0;
  QObject::connect<void(QAction::*)(bool),void(QLineEdit::*)()const>
            (in_stack_fffffffffffff2d0,(offset_in_QAction_to_subr)in_stack_fffffffffffff2f0,
             (ContextType *)in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0,
             in_stack_fffffffffffff310);
  QMetaObject::Connection::~Connection(&local_508);
  bVar3 = isReadOnly((QLineEdit *)in_stack_fffffffffffff280);
  if (!bVar3) {
    tr((char *)in_stack_fffffffffffff288,(char *)in_stack_fffffffffffff280,in_stack_fffffffffffff27c
      );
    uVar7 = QCoreApplication::testAttribute(AA_DontShowShortcutsInContextMenus);
    bVar2 = false;
    bVar1 = false;
    bVar4 = false;
    bVar3 = false;
    if ((uVar7 & 1) == 0) {
      pQVar8 = QGuiApplicationPrivate::instance();
      QKeySequence::QKeySequence(local_598,Paste);
      bVar2 = true;
      uVar7 = QShortcutMap::hasShortcutForKeySequence((QKeySequence *)(pQVar8 + 0x140));
      if ((uVar7 & 1) != 0) goto LAB_005c9d44;
      local_5ba = 9;
      QKeySequence::QKeySequence(local_5e0,Paste);
      bVar1 = true;
      QKeySequence::toString((SequenceFormat)local_5d8);
      bVar4 = true;
      ::operator+((char16_t *)in_stack_fffffffffffff288,(QString *)in_stack_fffffffffffff280);
      bVar3 = true;
      ::QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<char16_t,_QString> *)CONCAT44(in_stack_fffffffffffff27c,uVar10));
    }
    else {
LAB_005c9d44:
      QString::QString((QString *)0x5c9d51);
    }
    ::operator+((QString *)in_stack_fffffffffffff288,(QString *)in_stack_fffffffffffff280);
    ::QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<QString,_QString> *)CONCAT44(in_stack_fffffffffffff27c,uVar10));
    pQVar9 = QWidget::addAction((QWidget *)in_stack_fffffffffffff290,
                                (QString *)in_stack_fffffffffffff288);
    QString::~QString((QString *)0x5c9dad);
    QStringBuilder<QString,_QString>::~QStringBuilder
              ((QStringBuilder<QString,_QString> *)in_stack_fffffffffffff280);
    QString::~QString((QString *)0x5c9dc7);
    if (bVar3) {
      QStringBuilder<char16_t,_QString>::~QStringBuilder
                ((QStringBuilder<char16_t,_QString> *)0x5c9de0);
    }
    if (bVar4) {
      QString::~QString((QString *)0x5c9df9);
    }
    if (bVar1) {
      QKeySequence::~QKeySequence(local_5e0);
    }
    if (bVar2) {
      QKeySequence::~QKeySequence(local_598);
    }
    QString::~QString((QString *)0x5c9e38);
    bVar3 = QWidgetLineControl::isReadOnly((QWidgetLineControl *)pQVar5->control);
    if (!bVar3) {
      QGuiApplication::clipboard();
      QClipboard::text((Mode)local_5f8);
      QString::isEmpty((QString *)0x5c9ea0);
    }
    QAction::setEnabled(SUB81(pQVar9,0));
    if (!bVar3) {
      QString::~QString((QString *)0x5c9edc);
    }
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_628,(Data *)0x0,L"edit-paste",10);
    QString::QString((QString *)in_stack_fffffffffffff280,
                     (DataPointer *)CONCAT44(in_stack_fffffffffffff27c,uVar10));
    QObject::setObjectName<void>
              ((QObject *)in_stack_fffffffffffff280,
               (QString *)CONCAT44(in_stack_fffffffffffff27c,uVar10));
    QString::~QString((QString *)0x5c9f90);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)in_stack_fffffffffffff280);
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_658,(Data *)0x0,L"edit-paste",10);
    QString::QString((QString *)in_stack_fffffffffffff280,
                     (DataPointer *)CONCAT44(in_stack_fffffffffffff27c,uVar10));
    setActionIcon((QAction *)in_stack_fffffffffffff280,
                  (QString *)CONCAT44(in_stack_fffffffffffff27c,uVar10));
    QString::~QString((QString *)0x5ca041);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)in_stack_fffffffffffff280);
    local_670 = paste;
    local_668 = 0;
    uVar10 = 0;
    QObject::connect<void(QAction::*)(bool),void(QLineEdit::*)()>
              (in_stack_fffffffffffff2d0,(offset_in_QAction_to_subr)in_stack_fffffffffffff2f0,
               (ContextType *)in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0,
               in_stack_fffffffffffff310);
    QMetaObject::Connection::~Connection(&local_660);
  }
  bVar3 = isReadOnly((QLineEdit *)in_stack_fffffffffffff280);
  if (!bVar3) {
    tr((char *)in_stack_fffffffffffff288,(char *)in_stack_fffffffffffff280,in_stack_fffffffffffff27c
      );
    in_stack_fffffffffffff2f0 =
         QWidget::addAction((QWidget *)in_stack_fffffffffffff290,
                            (QString *)in_stack_fffffffffffff288);
    QString::~QString((QString *)0x5ca13b);
    bVar4 = QWidgetLineControl::isReadOnly((QWidgetLineControl *)pQVar5->control);
    bVar3 = false;
    if (!bVar4) {
      QWidgetLineControl::text(in_stack_fffffffffffff290);
      bVar3 = true;
      bVar4 = QString::isEmpty((QString *)0x5ca1a8);
      if (!bVar4) {
        QWidgetLineControl::hasSelectedText(in_stack_fffffffffffff280);
      }
    }
    QAction::setEnabled(SUB81(in_stack_fffffffffffff2f0,0));
    if (bVar3) {
      QString::~QString((QString *)0x5ca206);
    }
    header = (Data *)0x0;
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_6d0,(Data *)0x0,L"edit-delete",0xb);
    QString::QString((QString *)in_stack_fffffffffffff280,
                     (DataPointer *)CONCAT44(in_stack_fffffffffffff27c,uVar10));
    QObject::setObjectName<void>
              ((QObject *)in_stack_fffffffffffff280,
               (QString *)CONCAT44(in_stack_fffffffffffff27c,uVar10));
    QString::~QString((QString *)0x5ca2b4);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)in_stack_fffffffffffff280);
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_700,header,L"edit-delete",0xb);
    in_stack_fffffffffffff310 = (ConnectionType)header;
    QString::QString((QString *)in_stack_fffffffffffff280,
                     (DataPointer *)CONCAT44(in_stack_fffffffffffff27c,uVar10));
    setActionIcon((QAction *)in_stack_fffffffffffff280,
                  (QString *)CONCAT44(in_stack_fffffffffffff27c,uVar10));
    QString::~QString((QString *)0x5ca365);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)in_stack_fffffffffffff280);
    local_718 = QWidgetLineControl::_q_deleteSelected;
    local_710 = 0;
    uVar10 = 0;
    QObject::connect<void(QAction::*)(bool),void(QWidgetLineControl::*)()>
              (in_stack_fffffffffffff2d0,(offset_in_QAction_to_subr)in_stack_fffffffffffff2f0,
               in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0,in_stack_fffffffffffff310);
    QMetaObject::Connection::~Connection(&local_708);
  }
  bVar3 = QMenu::isEmpty(in_stack_fffffffffffff2b8);
  if (!bVar3) {
    QMenu::addSeparator((QMenu *)in_stack_fffffffffffff290);
  }
  tr((char *)in_stack_fffffffffffff288,(char *)in_stack_fffffffffffff280,in_stack_fffffffffffff27c);
  uVar7 = QCoreApplication::testAttribute(AA_DontShowShortcutsInContextMenus);
  bVar2 = false;
  bVar1 = false;
  bVar4 = false;
  bVar3 = false;
  if ((uVar7 & 1) == 0) {
    pQVar8 = QGuiApplicationPrivate::instance();
    QKeySequence::QKeySequence(local_798,SelectAll);
    bVar2 = true;
    uVar7 = QShortcutMap::hasShortcutForKeySequence((QKeySequence *)(pQVar8 + 0x140));
    if ((uVar7 & 1) == 0) {
      local_7ba = 9;
      QKeySequence::QKeySequence(local_7e0,SelectAll);
      bVar1 = true;
      QKeySequence::toString((SequenceFormat)local_7d8);
      bVar4 = true;
      ::operator+((char16_t *)in_stack_fffffffffffff288,(QString *)in_stack_fffffffffffff280);
      bVar3 = true;
      ::QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<char16_t,_QString> *)CONCAT44(in_stack_fffffffffffff27c,uVar10));
      goto LAB_005ca540;
    }
  }
  QString::QString((QString *)0x5ca540);
LAB_005ca540:
  ::operator+((QString *)in_stack_fffffffffffff288,(QString *)in_stack_fffffffffffff280);
  ::QStringBuilder::operator_cast_to_QString
            ((QStringBuilder<QString,_QString> *)CONCAT44(in_stack_fffffffffffff27c,uVar10));
  this_00 = (QUnicodeControlCharacterMenu *)
            QWidget::addAction((QWidget *)in_stack_fffffffffffff290,
                               (QString *)in_stack_fffffffffffff288);
  QString::~QString((QString *)0x5ca599);
  QStringBuilder<QString,_QString>::~QStringBuilder
            ((QStringBuilder<QString,_QString> *)in_stack_fffffffffffff280);
  QString::~QString((QString *)0x5ca5b3);
  if (bVar3) {
    QStringBuilder<char16_t,_QString>::~QStringBuilder
              ((QStringBuilder<char16_t,_QString> *)0x5ca5cc);
  }
  if (bVar4) {
    QString::~QString((QString *)0x5ca5e5);
  }
  if (bVar1) {
    QKeySequence::~QKeySequence(local_7e0);
  }
  if (bVar2) {
    QKeySequence::~QKeySequence(local_798);
  }
  QString::~QString((QString *)0x5ca624);
  sender = this_00;
  QWidgetLineControl::text(in_stack_fffffffffffff290);
  bVar3 = QString::isEmpty((QString *)0x5ca65a);
  if (!bVar3) {
    QWidgetLineControl::allSelected(in_stack_fffffffffffff290);
  }
  QAction::setEnabled(SUB81(sender,0));
  QString::~QString((QString *)0x5ca6a2);
  QArrayDataPointer<char16_t>::QArrayDataPointer(local_828,(Data *)0x0,L"select-all",10);
  QString::QString((QString *)in_stack_fffffffffffff280,
                   (DataPointer *)CONCAT44(in_stack_fffffffffffff27c,uVar10));
  QObject::setObjectName<void>
            ((QObject *)in_stack_fffffffffffff280,
             (QString *)CONCAT44(in_stack_fffffffffffff27c,uVar10));
  QString::~QString((QString *)0x5ca72e);
  QArrayDataPointer<char16_t>::~QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)in_stack_fffffffffffff280);
  this_01 = &local_858;
  QArrayDataPointer<char16_t>::QArrayDataPointer(this_01,(Data *)0x0,L"edit-select-all",0xf);
  slot = local_840;
  QString::QString((QString *)in_stack_fffffffffffff280,
                   (DataPointer *)CONCAT44(in_stack_fffffffffffff27c,uVar10));
  setActionIcon((QAction *)in_stack_fffffffffffff280,
                (QString *)CONCAT44(in_stack_fffffffffffff27c,uVar10));
  QString::~QString((QString *)0x5ca7c0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)in_stack_fffffffffffff280);
  QPointer<QAction>::operator=
            ((QPointer<QAction> *)in_stack_fffffffffffff280,
             (QAction *)CONCAT44(in_stack_fffffffffffff27c,uVar10));
  QObject::connect<void(QAction::*)(bool),void(QLineEdit::*)()>
            ((Object *)sender,(offset_in_QAction_to_subr)in_stack_fffffffffffff2f0,
             (ContextType *)this_01,slot,in_stack_fffffffffffff310);
  QMetaObject::Connection::~Connection(&local_860);
  bVar3 = QWidgetLineControl::isReadOnly((QWidgetLineControl *)pQVar5->control);
  if (!bVar3) {
    QGuiApplication::styleHints();
    uVar7 = QStyleHints::useRtlExtensions();
    if ((uVar7 & 1) != 0) {
      QMenu::addSeparator((QMenu *)in_stack_fffffffffffff290);
      _editWidget = (QObject *)operator_new(0x30);
      QUnicodeControlCharacterMenu::QUnicodeControlCharacterMenu
                (this_00,_editWidget,in_stack_fffffffffffff288);
      QMenu::addMenu((QMenu *)_editWidget,(QMenu *)in_stack_fffffffffffff288);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return pQVar6;
}

Assistant:

QMenu *QLineEdit::createStandardContextMenu()
{
    Q_D(QLineEdit);
    QMenu *popup = new QMenu(this);
    popup->setObjectName("qt_edit_menu"_L1);
    QAction *action = nullptr;

    if (!isReadOnly()) {
        action = popup->addAction(QLineEdit::tr("&Undo") + ACCEL_KEY(QKeySequence::Undo));
        action->setEnabled(d->control->isUndoAvailable());
        action->setObjectName(QStringLiteral("edit-undo"));
        setActionIcon(action, QStringLiteral("edit-undo"));
        connect(action, &QAction::triggered, this, &QLineEdit::undo);

        action = popup->addAction(QLineEdit::tr("&Redo") + ACCEL_KEY(QKeySequence::Redo));
        action->setEnabled(d->control->isRedoAvailable());
        action->setObjectName(QStringLiteral("edit-redo"));
        setActionIcon(action, QStringLiteral("edit-redo"));
        connect(action, &QAction::triggered, this, &QLineEdit::redo);

        popup->addSeparator();
    }

#ifndef QT_NO_CLIPBOARD
    if (!isReadOnly()) {
        action = popup->addAction(QLineEdit::tr("Cu&t") + ACCEL_KEY(QKeySequence::Cut));
        action->setEnabled(!d->control->isReadOnly() && d->control->hasSelectedText()
                && d->control->echoMode() == QLineEdit::Normal);
        action->setObjectName(QStringLiteral("edit-cut"));
        setActionIcon(action, QStringLiteral("edit-cut"));
        connect(action, &QAction::triggered, this, &QLineEdit::cut);
    }

    action = popup->addAction(QLineEdit::tr("&Copy") + ACCEL_KEY(QKeySequence::Copy));
    action->setEnabled(d->control->hasSelectedText()
            && d->control->echoMode() == QLineEdit::Normal);
    action->setObjectName(QStringLiteral("edit-copy"));
    setActionIcon(action, QStringLiteral("edit-copy"));
    connect(action, &QAction::triggered, this, &QLineEdit::copy);

    if (!isReadOnly()) {
        action = popup->addAction(QLineEdit::tr("&Paste") + ACCEL_KEY(QKeySequence::Paste));
        action->setEnabled(!d->control->isReadOnly() && !QGuiApplication::clipboard()->text().isEmpty());
        action->setObjectName(QStringLiteral("edit-paste"));
        setActionIcon(action, QStringLiteral("edit-paste"));
        connect(action, &QAction::triggered, this, &QLineEdit::paste);
    }
#endif

    if (!isReadOnly()) {
        action = popup->addAction(QLineEdit::tr("Delete"));
        action->setEnabled(!d->control->isReadOnly() && !d->control->text().isEmpty() && d->control->hasSelectedText());
        action->setObjectName(QStringLiteral("edit-delete"));
        setActionIcon(action, QStringLiteral("edit-delete"));
        connect(action, &QAction::triggered,
                d->control, &QWidgetLineControl::_q_deleteSelected);
    }

    if (!popup->isEmpty())
        popup->addSeparator();

    action = popup->addAction(QLineEdit::tr("Select All") + ACCEL_KEY(QKeySequence::SelectAll));
    action->setEnabled(!d->control->text().isEmpty() && !d->control->allSelected());
    action->setObjectName(QStringLiteral("select-all"));
    setActionIcon(action, QStringLiteral("edit-select-all"));
    d->selectAllAction = action;
    connect(action, &QAction::triggered, this, &QLineEdit::selectAll);

    if (!d->control->isReadOnly() && QGuiApplication::styleHints()->useRtlExtensions()) {
        popup->addSeparator();
        QUnicodeControlCharacterMenu *ctrlCharacterMenu = new QUnicodeControlCharacterMenu(this, popup);
        popup->addMenu(ctrlCharacterMenu);
    }
    return popup;
}